

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<unsigned_long_long,QSslServerPrivate::SocketData>::
emplace<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
          (QHash<unsigned_long_long,QSslServerPrivate::SocketData> *this,unsigned_long_long *key,
          Connection *args,Connection *args_1,shared_ptr<QTimer> *args_2)

{
  Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  Connection CStack_68;
  Connection local_60;
  SocketData local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *)0x0)
  {
    local_58.readyReadConnection.d_ptr =
         (Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *)0x0;
LAB_002533bc:
    pDVar1 = (Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *)0x0;
LAB_002533de:
    pDVar1 = QHashPrivate::
             Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::detached
                       (pDVar1);
    *(Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> **)this = pDVar1;
LAB_002533e6:
    pVar2 = (piter)emplace_helper<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
                             (this,key,args,args_1,args_2);
    QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::~QHash
              ((QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *)&local_58);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_58.readyReadConnection.d_ptr = pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> **)
                  this;
        if (pDVar1 == (Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>
                       *)0x0) goto LAB_002533bc;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_002533de;
      goto LAB_002533e6;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        pVar2 = (piter)emplace_helper<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
                                 (this,key,args,args_1,args_2);
        return (iterator)pVar2;
      }
      goto LAB_002534ce;
    }
    QMetaObject::Connection::Connection(&local_60,args);
    QMetaObject::Connection::Connection(&CStack_68,args_1);
    QMetaObject::Connection::Connection(&local_58.readyReadConnection,&local_60);
    QMetaObject::Connection::Connection(&local_58.destroyedConnection,&CStack_68);
    local_58.timeoutTimer.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (args_2->super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_58.timeoutTimer.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (args_2->super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (args_2->super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (args_2->super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
    pVar2 = (piter)QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::
                   emplace_helper<QSslServerPrivate::SocketData>
                             ((QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *)this,key,
                              &local_58);
    if (local_58.timeoutTimer.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.timeoutTimer.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    QMetaObject::Connection::~Connection(&local_58.destroyedConnection);
    QMetaObject::Connection::~Connection(&local_58.readyReadConnection);
    QMetaObject::Connection::~Connection(&CStack_68);
    QMetaObject::Connection::~Connection(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (iterator)pVar2;
  }
LAB_002534ce:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }